

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

char * make_tmp_buffer(FFSBuffer buf,int64_t size)

{
  void *pvVar1;
  void *in_RSI;
  long *in_RDI;
  int64_t tmp_size;
  void *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  char *local_8;
  
  if (in_RDI[1] < 0) {
    if (-in_RDI[1] < (long)in_RSI) {
      local_8 = (char *)0x0;
    }
    else {
      local_8 = (char *)*in_RDI;
    }
  }
  else {
    if (in_RDI[1] == 0) {
      in_stack_ffffffffffffffd8 = in_RSI;
      if ((long)in_RSI < 0x400) {
        in_stack_ffffffffffffffd8 = (void *)0x400;
      }
      in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffd8;
      pvVar1 = ffs_malloc((size_t)in_stack_ffffffffffffffd8);
      *in_RDI = (long)pvVar1;
      in_RDI[1] = (long)in_stack_ffffffffffffffe0;
    }
    if (in_RDI[1] < (long)in_RSI) {
      pvVar1 = ffs_realloc(in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8);
      *in_RDI = (long)pvVar1;
      if (*in_RDI == 0) {
        in_RDI[1] = 0;
      }
      else {
        in_RDI[1] = (long)in_RSI;
      }
    }
    in_RDI[2] = (long)in_RSI;
    local_8 = (char *)*in_RDI;
  }
  return local_8;
}

Assistant:

extern
char *
make_tmp_buffer(FFSBuffer buf, int64_t size)
{
    if (buf->tmp_buffer_size < 0) {
	/* fixed size buffer */
	if (size > (-buf->tmp_buffer_size)) return NULL;
	return buf->tmp_buffer;
    }
    if (buf->tmp_buffer_size == 0) {
	int64_t tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	buf->tmp_buffer = malloc(tmp_size);
	buf->tmp_buffer_size = tmp_size;
    }
    if (size > buf->tmp_buffer_size) {
	buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	if (buf->tmp_buffer) {
	    buf->tmp_buffer_size = size;
	} else {
	    buf->tmp_buffer_size = 0;
	}
    }
    buf->tmp_buffer_in_use_size = size;
    return buf->tmp_buffer;
}